

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O1

void merge_cache_lcp_2way<true,unsigned_short>
               (uchar **from0,lcp_t *lcp_input0,unsigned_short *cache_input0,size_t n0,uchar **from1
               ,lcp_t *lcp_input1,unsigned_short *cache_input1,size_t n1,uchar **result,
               lcp_t *lcp_result,unsigned_short *cache_result)

{
  uchar *puVar1;
  uchar *puVar2;
  char *pcVar3;
  ulong uVar4;
  uchar **ppuVar5;
  int iVar6;
  ostream *poVar7;
  size_t sVar8;
  ushort *puVar9;
  long lVar10;
  ushort c;
  ulong *puVar11;
  long lVar12;
  ushort *puVar13;
  ushort *puVar14;
  lcp_t *plVar15;
  ushort c_00;
  unsigned_short uVar16;
  ushort *puVar17;
  ushort *puVar18;
  uchar **ppuVar19;
  uchar **__dest;
  ulong *puVar20;
  ushort *puVar21;
  uchar **ppuVar22;
  bool bVar23;
  bool bVar24;
  uchar **local_118;
  ulong local_110;
  ulong *local_100;
  size_t local_f8;
  ushort *local_e8;
  long local_d8;
  size_t local_b0;
  ulong local_a0;
  lcp_t *local_90;
  size_t local_88;
  string local_70;
  string local_50;
  
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"merge_cache_lcp_2way",0x14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(): n0=",7);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,", n1=",5);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  local_70._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_70,1);
  check_input<unsigned_short>(from0,lcp_input0,cache_input0,n0);
  local_f8 = n1;
  check_input<unsigned_short>(from1,lcp_input1,cache_input1,n1);
  puVar9 = cache_input0 + 1;
  c_00 = *cache_input0;
  local_e8 = cache_input1 + 1;
  c = *cache_input1;
  local_100 = lcp_input1;
  local_118 = from1;
  if (c_00 < c) {
    puVar1 = *from0;
    if (puVar1 == (uchar *)0x0) {
LAB_0024888f:
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x51,"int cmp(const unsigned char *, const unsigned char *)");
    }
    puVar2 = *from1;
    if (puVar2 == (uchar *)0x0) {
LAB_002488ae:
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x52,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar6 = strcmp((char *)puVar1,(char *)puVar2);
    if (-1 < iVar6) {
      __assert_fail("cmp(*from0, *from1) < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x449,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                   );
    }
    if (c_00 == c) {
LAB_002488ec:
      __assert_fail("a != b or a==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x3f6,"unsigned int lcp(uint16_t, uint16_t)");
    }
    bVar23 = (c_00 & 0xff00) != 0;
    bVar24 = (c_00 & 0xff00) == (c & 0xff00);
    if (bVar24 && bVar23) {
      if (puVar2[1] == '\0') {
        c = 0;
      }
      else {
        c = CONCAT11(puVar2[1],puVar2[2]);
      }
    }
    *result = puVar1;
    __dest = result + 1;
    *cache_result = c_00;
    puVar18 = cache_result + 1;
    local_a0 = (ulong)(bVar24 && bVar23);
    n0 = n0 - 1;
    if (n0 == 0) {
LAB_0024779d:
      local_b0 = 0;
LAB_002484fa:
      if (local_b0 != 0) {
        __assert_fail("n0==0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x51d,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                     );
      }
      if (local_f8 == 0) {
        __assert_fail("n1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x51e,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                     );
      }
      *lcp_result = local_a0;
      *puVar18 = c;
      memmove(__dest,local_118,local_f8 * 8);
      memmove(lcp_result + 1,local_100,local_f8 * 8);
      goto LAB_0024854e;
    }
    from0 = from0 + 1;
    local_110 = *lcp_input0;
    lcp_input0 = lcp_input0 + 1;
    c_00 = cache_input0[1];
    puVar9 = cache_input0 + 2;
LAB_00247877:
    puVar18 = cache_result + 1;
    __dest = result + 1;
    ppuVar5 = from0;
    local_118 = from1;
    do {
      while( true ) {
        ppuVar22 = ppuVar5;
        puVar20 = lcp_result;
        ppuVar19 = __dest;
        puVar17 = puVar18;
        plVar15 = lcp_input0;
        puVar14 = puVar9;
        local_d8 = 0;
        lVar12 = 0;
        from0 = ppuVar22;
        puVar11 = puVar20;
        puVar13 = puVar14;
        puVar21 = puVar17;
        local_90 = plVar15;
        local_88 = n0;
        while( true ) {
          local_b0 = n0 - 1;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                              __debug_indent_str_abi_cxx11_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Starting loop, n0=",0x12);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,", n1=",5);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," ...\n",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\tprev   = \'",0xb);
          pcVar3 = *(char **)((long)ppuVar19 + lVar12 + -8);
          iVar6 = (int)poVar7;
          if (pcVar3 == (char *)0x0) {
            std::ios::clear(iVar6 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
          }
          else {
            sVar8 = strlen(pcVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar3,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'\n",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t*from0 = \'",0xb);
          pcVar3 = *(char **)((long)ppuVar22 + lVar12);
          if (pcVar3 == (char *)0x0) {
            std::ios::clear(iVar6 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
          }
          else {
            sVar8 = strlen(pcVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar3,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'\n",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t*from1 = \'",0xb);
          puVar1 = *local_118;
          if (puVar1 == (uchar *)0x0) {
            std::ios::clear(iVar6 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
          }
          else {
            sVar8 = strlen((char *)puVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)puVar1,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'\n",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\tlcp0   = ",10);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\tlcp1   = ",10);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\tcache0 = \'",0xb);
          to_str_abi_cxx11_(&local_70,c_00);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(char *)CONCAT71(local_70._M_dataplus._M_p._1_7_,
                                                      local_70._M_dataplus._M_p._0_1_),
                              CONCAT44(local_70._M_string_length._4_4_,
                                       (int)local_70._M_string_length));
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'\n",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\tcache1 = \'",0xb);
          to_str_abi_cxx11_(&local_50,c);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_50._M_dataplus._M_p,local_50._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'\n",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_) !=
              &local_70.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_
                                    ));
          }
          check_lcp_and_cache<unsigned_short>
                    (*(uchar **)((long)ppuVar19 + lVar12 + -8),*(uchar **)((long)ppuVar22 + lVar12),
                     local_110,c_00,*local_118,local_a0,c);
          if (local_110 <= local_a0) break;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                              __debug_indent_str_abi_cxx11_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\tlcp0 > lcp1\n",0xd);
          pcVar3 = *(char **)((long)ppuVar22 + lVar12);
          if (pcVar3 == (char *)0x0) goto LAB_0024888f;
          if (*local_118 == (uchar *)0x0) goto LAB_002488ae;
          iVar6 = strcmp(pcVar3,(char *)*local_118);
          if (-1 < iVar6) {
            __assert_fail("cmp(*from0, *from1) < 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x4ae,
                          "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                         );
          }
          *(char **)((long)ppuVar19 + lVar12) = pcVar3;
          from0 = from0 + 1;
          puVar11 = puVar11 + 1;
          *(ulong *)((long)puVar20 + lVar12) = local_110;
          puVar21 = puVar21 + 1;
          *(ushort *)((long)puVar17 + local_d8) = c_00;
          local_90 = local_90 + 1;
          local_110 = *(lcp_t *)((long)plVar15 + lVar12);
          puVar13 = puVar13 + 1;
          c_00 = *(ushort *)((long)puVar14 + local_d8);
          local_88 = local_88 - 1;
          lVar12 = lVar12 + 8;
          local_d8 = local_d8 + 2;
          n0 = local_b0;
          if (local_b0 == 0) {
            __dest = (uchar **)((long)ppuVar19 + lVar12);
            lcp_result = (lcp_t *)((long)puVar20 + lVar12);
            puVar18 = (ushort *)((long)puVar17 + local_d8);
            local_b0 = 0;
            goto LAB_002484fa;
          }
        }
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        if (local_110 < local_a0) break;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\tlcp0 == lcp1\n",0xe);
        if (c_00 < c) {
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                              __debug_indent_str_abi_cxx11_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t\tcache0 < cache1\n",0x12);
          pcVar3 = *(char **)((long)ppuVar22 + lVar12);
          if (pcVar3 == (char *)0x0) goto LAB_0024888f;
          puVar1 = *local_118;
          if (puVar1 == (uchar *)0x0) goto LAB_002488ae;
          iVar6 = strcmp(pcVar3,(char *)puVar1);
          if (-1 < iVar6) {
            __assert_fail("cmp(*from0, *from1) < 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x4c6,
                          "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                         );
          }
          if (((c_00 & 0xff00) != 0) && ((c_00 & 0xff00) == (c & 0xff00))) {
            if (puVar1[local_a0 + 1] == '\0') {
              c = 0;
              local_a0 = local_a0 + 1;
            }
            else {
              c = CONCAT11(puVar1[local_a0 + 1],puVar1[local_a0 + 2]);
              local_a0 = local_a0 + 1;
            }
          }
          *(char **)((long)ppuVar19 + lVar12) = pcVar3;
          *(ulong *)((long)puVar20 + lVar12) = local_110;
          *(ushort *)((long)puVar17 + local_d8) = c_00;
          if (local_b0 == 0) {
            __dest = (uchar **)((long)ppuVar19 + lVar12 + 8);
            lcp_result = (lcp_t *)((long)puVar20 + lVar12 + 8);
            puVar18 = (ushort *)((long)puVar17 + local_d8 + 2);
            local_b0 = 0;
            goto LAB_002484fa;
          }
LAB_00247fd6:
          lcp_input0 = (lcp_t *)((long)plVar15 + lVar12 + 8);
          c_00 = *(ushort *)((long)puVar14 + local_d8);
          local_110 = lcp_input0[-1];
          n0 = local_b0;
          puVar9 = (ushort *)((long)puVar14 + local_d8) + 1;
          puVar18 = (ushort *)((long)puVar17 + local_d8 + 2);
          __dest = (uchar **)((long)ppuVar19 + lVar12 + 8);
          lcp_result = (ulong *)((long)puVar20 + lVar12 + 8);
          ppuVar5 = (uchar **)((long)ppuVar22 + lVar12 + 8);
        }
        else {
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                              __debug_indent_str_abi_cxx11_._M_string_length);
          if (c < c_00) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t\tcache0 > cache1\n",0x12);
            pcVar3 = *(char **)((long)ppuVar22 + lVar12);
            if (pcVar3 == (char *)0x0) goto LAB_0024888f;
            puVar1 = *local_118;
            if (puVar1 == (uchar *)0x0) goto LAB_002488ae;
            iVar6 = strcmp(pcVar3,(char *)puVar1);
            if (iVar6 < 1) {
              __assert_fail("cmp(*from0, *from1) > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                            ,0x4d6,
                            "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                           );
            }
            if (((c_00 & 0xff00) != 0) && ((c_00 & 0xff00) == (c & 0xff00))) {
              if (pcVar3[local_110 + 1] == '\0') {
                c_00 = 0;
                local_110 = local_110 + 1;
              }
              else {
                c_00 = CONCAT11(pcVar3[local_110 + 1],pcVar3[local_110 + 2]);
                local_110 = local_110 + 1;
              }
            }
            local_118 = local_118 + 1;
            *(undefined8 *)((long)ppuVar19 + lVar12) = puVar1;
            lcp_result = (lcp_t *)((long)puVar20 + lVar12 + 8);
            lcp_result[-1] = local_a0;
            puVar18 = (ushort *)((long)puVar17 + local_d8 + 2);
            puVar18[-1] = c;
            local_a0 = *local_100;
            local_100 = local_100 + 1;
            c = *local_e8;
            local_e8 = local_e8 + 1;
            local_f8 = local_f8 - 1;
            puVar9 = (ushort *)((long)puVar14 + local_d8);
            lcp_input0 = (lcp_t *)((long)plVar15 + lVar12);
            __dest = (uchar **)((undefined8 *)((long)ppuVar19 + lVar12) + 1);
            ppuVar5 = (uchar **)((long)ppuVar22 + lVar12);
            if (local_f8 == 0) {
              __dest = (uchar **)((long)ppuVar19 + lVar12 + 8);
              lcp_result = (lcp_t *)((long)puVar20 + lVar12 + 8);
              puVar18 = (ushort *)((long)puVar17 + local_d8 + 2);
              local_90 = (lcp_t *)((long)plVar15 + lVar12);
              from0 = (uchar **)((long)ppuVar22 + lVar12);
              local_f8 = 0;
              puVar13 = (ushort *)((long)puVar14 + local_d8);
              goto LAB_0024882f;
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t\tcache0 == cache1\n",0x13)
            ;
            if ((char)c_00 == '\0') {
              pcVar3 = *(char **)((long)ppuVar22 + lVar12);
              if (pcVar3 == (char *)0x0) goto LAB_0024888f;
              if (*local_118 == (uchar *)0x0) goto LAB_002488ae;
              iVar6 = strcmp(pcVar3,(char *)*local_118);
              if (iVar6 != 0) {
                __assert_fail("cmp(*from0, *from1) == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                              ,0x4e7,
                              "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                             );
              }
              *(char **)((long)ppuVar19 + lVar12) = pcVar3;
              *(ulong *)((long)puVar20 + lVar12) = local_110;
              *(ushort *)((long)puVar17 + local_d8) = c_00;
              if ((c_00 != 0) && (c_00 == c)) goto LAB_002488ec;
              local_a0 = local_a0 + (c_00 == (c & 0xff00) && c_00 != 0);
              if (local_b0 != 0) {
                c = 0;
                goto LAB_00247fd6;
              }
              __dest = (uchar **)((long)ppuVar19 + lVar12 + 8);
              lcp_result = (lcp_t *)((long)puVar20 + lVar12 + 8);
              puVar18 = (ushort *)((long)puVar17 + local_d8 + 2);
              c = 0;
              goto LAB_0024779d;
            }
            from0 = (uchar **)((long)ppuVar22 + lVar12);
            compare((uchar *)&local_70,*(uchar **)((long)ppuVar22 + lVar12),(size_t)*local_118);
            uVar4 = CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_);
            puVar9 = (ushort *)((long)puVar14 + local_d8);
            local_90 = (lcp_t *)((long)plVar15 + lVar12);
            local_a0 = uVar4;
            if ((int)local_70._M_string_length < 0) {
              *(undefined8 *)((long)ppuVar19 + lVar12) = *(undefined8 *)((long)ppuVar22 + lVar12);
              *(ulong *)((long)puVar20 + lVar12) = local_110;
              *(ushort *)((long)puVar17 + local_d8) = c_00;
              puVar1 = *local_118;
              if (puVar1 == (uchar *)0x0) goto LAB_00248a03;
              if (puVar1[uVar4] == '\0') {
                c = 0;
              }
              else {
                c = CONCAT11(puVar1[uVar4],puVar1[uVar4 + 1]);
              }
              from0 = (uchar **)(lVar12 + 8 + (long)ppuVar22);
              __dest = (uchar **)((long)ppuVar19 + lVar12 + 8);
              lcp_result = (lcp_t *)((long)puVar20 + lVar12 + 8);
              puVar18 = (ushort *)((long)puVar17 + local_d8 + 2);
              local_90 = (lcp_t *)((long)plVar15 + lVar12 + 8);
              local_110 = local_90[-1];
              puVar9 = (ushort *)((long)puVar14 + local_d8) + 1;
              c_00 = *(ushort *)((long)puVar14 + local_d8);
              if (local_b0 != 0) goto LAB_00248480;
LAB_00248491:
              iVar6 = 2;
              local_b0 = 0;
            }
            else {
              __dest = (uchar **)((long)ppuVar19 + lVar12 + 8);
              lcp_result = (lcp_t *)((long)puVar20 + lVar12 + 8);
              puVar18 = (ushort *)((long)puVar17 + local_d8 + 2);
              if ((int)local_70._M_string_length == 0) {
                from0 = (uchar **)((undefined8 *)((long)ppuVar22 + lVar12) + 1);
                *(undefined8 *)((long)ppuVar19 + lVar12) = *(undefined8 *)((long)ppuVar22 + lVar12);
                *(ulong *)((long)puVar20 + lVar12) = local_110;
                *(ushort *)((long)puVar17 + local_d8) = c_00;
                local_90 = (lcp_t *)((long)plVar15 + lVar12 + 8);
                local_110 = local_90[-1];
                puVar9 = (ushort *)((long)puVar14 + local_d8) + 1;
                c_00 = *(ushort *)((long)puVar14 + local_d8);
                c = 0;
                if (local_b0 == 0) {
                  c = 0;
                  goto LAB_00248491;
                }
              }
              else {
                *(uchar **)((long)ppuVar19 + lVar12) = *local_118;
                *(ulong *)((long)puVar20 + lVar12) = local_110;
                *(ushort *)((long)puVar17 + local_d8) = c_00;
                puVar1 = *from0;
                if (puVar1 == (uchar *)0x0) goto LAB_00248a03;
                if (puVar1[uVar4] == '\0') {
                  c_00 = 0;
                }
                else {
                  c_00 = CONCAT11(puVar1[uVar4],puVar1[uVar4 + 1]);
                }
                local_118 = local_118 + 1;
                local_a0 = *local_100;
                local_100 = local_100 + 1;
                c = *local_e8;
                local_e8 = local_e8 + 1;
                local_f8 = local_f8 - 1;
                local_110 = uVar4;
                local_b0 = n0;
                if (local_f8 == 0) {
                  iVar6 = 3;
                  local_f8 = 0;
                  goto LAB_0024849f;
                }
              }
LAB_00248480:
              iVar6 = 0;
            }
LAB_0024849f:
            n0 = local_b0;
            lcp_input0 = local_90;
            ppuVar5 = from0;
            if (iVar6 != 0) {
              if (iVar6 == 1) {
                return;
              }
              puVar13 = puVar9;
              if (iVar6 != 2) goto LAB_0024882f;
              goto LAB_002484fa;
            }
          }
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\tlcp0 < lcp1\n",0xd);
      if (*(char **)((long)ppuVar22 + lVar12) == (char *)0x0) goto LAB_0024888f;
      puVar1 = *local_118;
      if (puVar1 == (uchar *)0x0) goto LAB_002488ae;
      iVar6 = strcmp(*(char **)((long)ppuVar22 + lVar12),(char *)puVar1);
      if (iVar6 < 1) {
        __assert_fail("cmp(*from0, *from1) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x4b7,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                     );
      }
      *(undefined8 *)((long)ppuVar19 + lVar12) = puVar1;
      *(ulong *)((long)puVar20 + lVar12) = local_a0;
      local_118 = local_118 + 1;
      *(uint16_t *)((long)puVar17 + local_d8) = c;
      local_a0 = *local_100;
      local_100 = local_100 + 1;
      c = *local_e8;
      local_e8 = local_e8 + 1;
      local_f8 = local_f8 - 1;
      puVar9 = (ushort *)((long)puVar14 + local_d8);
      lcp_input0 = (lcp_t *)((long)plVar15 + lVar12);
      puVar18 = (uint16_t *)((long)puVar17 + local_d8) + 1;
      __dest = (uchar **)((undefined8 *)((long)ppuVar19 + lVar12) + 1);
      lcp_result = (ulong *)((long)puVar20 + lVar12) + 1;
      ppuVar5 = (uchar **)((long)ppuVar22 + lVar12);
    } while (local_f8 != 0);
    lcp_result = puVar11 + 1;
    puVar18 = puVar21 + 1;
    __dest = (uchar **)((long)ppuVar19 + lVar12 + 8);
    local_f8 = 0;
    n0 = local_88;
  }
  else {
    if (c_00 <= c) {
      if ((char)c_00 != '\0') {
        compare((uchar *)&local_70,*from0,(size_t)*from1);
        lVar12 = CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_);
        if ((int)local_70._M_string_length < 0) {
          *result = *from0;
          *cache_result = c_00;
          if (*from1 == (uchar *)0x0) {
LAB_00248a03:
            __assert_fail("ptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                          ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
          }
          uVar16 = cache_input0[1];
          puVar9 = cache_input0 + 2;
          if (n0 == 1) {
            lVar10 = 2;
            goto LAB_002486ed;
          }
        }
        else if ((int)local_70._M_string_length == 0) {
          *result = *from0;
          *cache_result = c_00;
          uVar16 = cache_input0[1];
          puVar9 = cache_input0 + 2;
          if (n0 == 1) {
            lVar10 = 2;
            goto LAB_002486ed;
          }
        }
        else {
          *result = *from1;
          *cache_result = c;
          puVar1 = *from0;
          if (puVar1 == (uchar *)0x0) goto LAB_00248a03;
          if (puVar1[lVar12] == '\0') {
            uVar16 = 0;
          }
          else {
            uVar16 = CONCAT11(puVar1[lVar12],puVar1[lVar12 + 1]);
          }
          from1 = from1 + 1;
          local_118 = from1;
          if (n1 == 1) {
            lVar10 = 3;
            goto LAB_002486ed;
          }
        }
        lVar10 = 0;
        from1 = local_118;
LAB_002486ed:
        (*(code *)((long)&DAT_00269020 + (long)(int)(&DAT_00269020)[lVar10]))
                  (lVar12,from1,lVar10,&DAT_00269020,puVar9,uVar16);
        return;
      }
      puVar1 = *from0;
      if (puVar1 == (uchar *)0x0) goto LAB_0024888f;
      if (*from1 == (uchar *)0x0) goto LAB_002488ae;
      iVar6 = strcmp((char *)puVar1,(char *)*from1);
      if (iVar6 != 0) {
        __assert_fail("cmp(*from0, *from1) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x470,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                     );
      }
      if (c_00 != 0 && c_00 == c) goto LAB_002488ec;
      *result = puVar1;
      __dest = result + 1;
      *cache_result = c_00;
      puVar18 = cache_result + 1;
      local_a0 = (ulong)(c_00 == (c & 0xff00) && c_00 != 0);
      c = 0;
      n0 = n0 - 1;
      if (n0 == 0) {
        local_b0 = 0;
        goto LAB_002484fa;
      }
      from0 = from0 + 1;
      local_110 = *lcp_input0;
      lcp_input0 = lcp_input0 + 1;
      c_00 = cache_input0[1];
      puVar9 = cache_input0 + 2;
      goto LAB_00247877;
    }
    puVar1 = *from0;
    if (puVar1 == (uchar *)0x0) goto LAB_0024888f;
    puVar2 = *from1;
    if (puVar2 == (uchar *)0x0) goto LAB_002488ae;
    iVar6 = strcmp((char *)puVar1,(char *)puVar2);
    if (iVar6 < 1) {
      __assert_fail("cmp(*from0, *from1) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x45c,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                   );
    }
    if (c_00 == c) goto LAB_002488ec;
    bVar23 = (c_00 & 0xff00) != 0;
    bVar24 = (c_00 & 0xff00) == (c & 0xff00);
    if (bVar24 && bVar23) {
      if (puVar1[1] == '\0') {
        c_00 = 0;
      }
      else {
        c_00 = CONCAT11(puVar1[1],puVar1[2]);
      }
    }
    *result = puVar2;
    __dest = result + 1;
    *cache_result = c;
    puVar18 = cache_result + 1;
    local_110 = (ulong)(bVar24 && bVar23);
    local_f8 = n1 - 1;
    if (local_f8 != 0) {
      from1 = from1 + 1;
      local_a0 = *lcp_input1;
      local_100 = lcp_input1 + 1;
      c = cache_input1[1];
      local_e8 = cache_input1 + 2;
      goto LAB_00247877;
    }
    local_f8 = 0;
    puVar13 = puVar9;
    local_90 = lcp_input0;
  }
LAB_0024882f:
  local_e8 = puVar13;
  if (n0 == 0) {
    __assert_fail("n0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x527,
                  "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                 );
  }
  if (local_f8 != 0) {
    __assert_fail("n1==0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x528,
                  "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                 );
  }
  *lcp_result = local_110;
  *puVar18 = c_00;
  memmove(__dest,from0,n0 * 8);
  memmove(lcp_result + 1,local_90,n0 * 8);
  local_f8 = n0;
LAB_0024854e:
  memmove(puVar18 + 1,local_e8,local_f8 * 2);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  local_70._M_dataplus._M_p._0_1_ = 0x7e;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_70,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"merge_cache_lcp_2way",0x14);
  local_70._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_70,1);
  return;
}

Assistant:

void
merge_cache_lcp_2way(
       unsigned char** from0,  lcp_t* restrict lcp_input0, CharT* restrict cache_input0, size_t n0,
       unsigned char** from1,  lcp_t* restrict lcp_input1, CharT* restrict cache_input1, size_t n1,
       unsigned char** result, lcp_t* restrict lcp_result, CharT* restrict cache_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';

	check_input(from0, lcp_input0, cache_input0, n0);
	check_input(from1, lcp_input1, cache_input1, n1);

	lcp_t lcp0=0, lcp1=0;
	CharT cache0 = *cache_input0++;
	CharT cache1 = *cache_input1++;
	{
		stat_try_cache();
		if (cache0 < cache1) {
			assert(cmp(*from0, *from1) < 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache1 = get_char<CharT>(*from1, l);
				}
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				lcp1 = l;
				cache0 = *cache_input0++;
			} else {
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
			}
			if (--n0 == 0) goto finish0;
		} else if (cache0 > cache1) {
			assert(cmp(*from0, *from1) > 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache0 = get_char<CharT>(*from0, l);
				}
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp0 = l;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			} else {
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			}
			if (--n1 == 0) goto finish1;
		} else {
			if (is_end(cache0)) {
				assert(cmp(*from0, *from1) == 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = l;
					cache0 = *cache_input0++;
					cache1 = 0;
				} else {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					cache0 = *cache_input0++;
					cache1 = 0;
				}
				if (--n0 == 0) goto finish0;
			} else {
				stat_cache_useless();
				int cmp01; lcp_t lcp01;
				std::tie(cmp01, lcp01) = compare(*from0, *from1, sizeof(CharT));
				if (cmp01 < 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = get_char<CharT>(*from1, lcp01);
					if (--n0 == 0) goto finish0;
				} else if (cmp01 == 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = 0;
					if (--n0 == 0) goto finish0;
				} else {
					*result++ = *from1++;
					if (OutputLCP) *cache_result++ = cache1;
					lcp0 = lcp01;
					lcp1 = *lcp_input1++;
					cache0 = get_char<CharT>(*from0, lcp01);
					cache1 = *cache_input1++;
					if (--n1 == 0) goto finish1;
				}
			}
		}
	}
	while (true) {
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
			<< "\tprev   = '"<<*(result-1)<<"'\n"
			<< "\t*from0 = '"<<*from0<<"'\n"
			<< "\t*from1 = '"<<*from1<<"'\n"
			<< "\tlcp0   = " <<lcp0<<"\n"
			<< "\tlcp1   = " <<lcp1<<"\n"
			<< "\tcache0 = '"<<to_str(cache0)<<"'\n"
			<< "\tcache1 = '"<<to_str(cache1)<<"'\n"
			<< "\n";
		check_lcp_and_cache(*(result-1),*from0,lcp0,cache0,*from1,lcp1,cache1);
		if (lcp0 > lcp1) {
			debug() << "\tlcp0 > lcp1\n";
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			if (OutputLCP) *cache_result++ = cache0;
			lcp0 = *lcp_input0++;
			cache0 = *cache_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			debug() << "\tlcp0 < lcp1\n";
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			if (OutputLCP) *cache_result++ = cache1;
			lcp1 = *lcp_input1++;
			cache1 = *cache_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			debug() << "\tlcp0 == lcp1\n";
			stat_try_cache();
			// Both strings in the sorted sequences have the same
			// prefix than the latest string in output. Check
			// cached characters first.
			if (cache0 < cache1) {
				debug() << "\t\tcache0 < cache1\n";
				assert(cmp(*from0, *from1) < 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp1 += l;
						cache1 = get_char<CharT>(*from1, lcp1);
					}
				}
				*result++ = *from0++;
				if (OutputLCP) *lcp_result++ = lcp0;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
				if (--n0 == 0) goto finish0;
			} else if (cache0 > cache1) {
				debug() << "\t\tcache0 > cache1\n";
				assert(cmp(*from0, *from1) > 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp0 += l;
						cache0 = get_char<CharT>(*from0, lcp0);
					}
				}
				*result++ = *from1++;
				if (OutputLCP) *lcp_result++ = lcp1;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
				if (--n1 == 0) goto finish1;
			} else {
				debug() << "\t\tcache0 == cache1\n";
				if (is_end(cache0)) {
					assert(cmp(*from0, *from1) == 0);
					if (sizeof(CharT) > 1) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 += lcp(cache0, cache1);
						cache0 = *cache_input0++;
						cache1 = 0;
					} else {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						cache0 = *cache_input0++;
					}
					if (--n0 == 0) goto finish0;
				} else {
					stat_cache_useless();
					int cmp01; lcp_t lcp01;
					std::tie(cmp01, lcp01) = compare(*from0, *from1, lcp0+sizeof(CharT));
					if (cmp01 < 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = get_char<CharT>(*from1, lcp01);
						if (--n0 == 0) goto finish0;
					} else if (cmp01 == 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = 0;
						if (--n0 == 0) goto finish0;
					} else {
						*result++ = *from1++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = lcp01;
						lcp1 = *lcp_input1++;
						cache0 = get_char<CharT>(*from0, lcp01);
						cache1 = *cache_input1++;
						if (--n1 == 0) goto finish1;
					}
				}
			}
		}
	}
finish0:
	assert(n0==0);
	assert(n1);
	if (OutputLCP) *lcp_result++ = lcp1;
	if (OutputLCP) *cache_result++ = cache1;
	std::copy(from1, from1+n1, result);
	if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	if (OutputLCP) std::copy(cache_input1, cache_input1+n1, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
finish1:
	assert(n0);
	assert(n1==0);
	if (OutputLCP) *lcp_result++ = lcp0;
	if (OutputLCP) *cache_result++ = cache0;
	std::copy(from0, from0+n0, result);
	if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	if (OutputLCP) std::copy(cache_input0, cache_input0+n0, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
}